

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O1

pair<const_int_*,_bool>
HighsHashTree<int,_void>::insert_recurse
          (NodePtr *insertNode,uint64_t hash,int hashPos,HighsHashTableEntry<int,_void> *entry)

{
  int *piVar1;
  char *pcVar2;
  bool bVar3;
  uint uVar4;
  byte bVar5;
  pair<const_int_*,_bool> pVar6;
  uint uVar7;
  InnerLeaf<1> *this;
  ValueType *pVVar8;
  ulong *puVar9;
  undefined8 *puVar10;
  sbyte sVar11;
  int iVar12;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  int iVar13;
  ulong uVar14;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar15;
  undefined8 extraout_RDX_04;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  array<HighsHashTableEntry<int,_void>,_54UL> *paVar19;
  int i;
  long lVar20;
  array<HighsHashTableEntry<int,_void>,_54UL> *paVar21;
  Entry *pEVar22;
  undefined8 *puVar23;
  BranchNode *branch;
  InnerLeaf<4> *this_00;
  pair<const_int_*,_bool> pVar24;
  pair<const_int_*,_bool> pVar25;
  array<unsigned_char,_55UL> sizes;
  undefined8 local_70;
  byte local_68 [56];
  
  uVar14 = insertNode->ptrAndType;
  switch((uint)uVar14 & 7) {
  case 0:
    if (hashPos != 9) {
      this = (InnerLeaf<1> *)operator_new(0x60);
      (this->occupation).occupation = 0;
      this->size = 0;
      (this->hashes)._M_elems[0] = 0;
      insertNode->ptrAndType = (ulong)this | 2;
      pVar24 = InnerLeaf<1>::insert_entry(this,hash,hashPos,entry);
      return pVar24;
    }
    puVar10 = (undefined8 *)operator_new(0x18);
    *puVar10 = 0;
    *(int *)(puVar10 + 1) = entry->value_;
    *(undefined4 *)(puVar10 + 2) = 1;
    insertNode->ptrAndType = (ulong)puVar10 | 1;
    uVar15 = extraout_RDX;
    goto LAB_0027812d;
  case 1:
    iVar13 = entry->value_;
    puVar10 = (undefined8 *)(uVar14 & 0xfffffffffffffff8);
    do {
      puVar23 = puVar10;
      if (*(int *)(puVar23 + 1) == iVar13) {
        pVar6._8_8_ = 0;
        pVar6.first = (int *)(puVar23 + 1);
        return pVar6;
      }
      puVar10 = (undefined8 *)*puVar23;
    } while ((undefined8 *)*puVar23 != (undefined8 *)0x0);
    puVar10 = (undefined8 *)operator_new(0x10);
    *puVar10 = 0;
    *(int *)(puVar10 + 1) = iVar13;
    *puVar23 = puVar10;
    piVar1 = (int *)((undefined8 *)(uVar14 & 0xfffffffffffffff8) + 2);
    *piVar1 = *piVar1 + 1;
    uVar15 = extraout_RDX_00;
LAB_0027812d:
    pVar25._9_7_ = (int7)((ulong)uVar15 >> 8);
    pVar25.second = true;
    pVar25.first = (int *)(puVar10 + 1);
    break;
  case 2:
    pVar25 = insert_into_leaf<1>(insertNode,(InnerLeaf<1> *)(uVar14 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 3:
    pVar25 = insert_into_leaf<2>(insertNode,(InnerLeaf<2> *)(uVar14 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 4:
    pVar25 = insert_into_leaf<3>(insertNode,(InnerLeaf<3> *)(uVar14 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 5:
    this_00 = (InnerLeaf<4> *)(uVar14 & 0xfffffffffffffff8);
    if (this_00->size < 0x36) {
      pVar24 = InnerLeaf<4>::insert_entry(this_00,hash,hashPos,entry);
      bVar3 = true;
    }
    else {
      pVVar8 = InnerLeaf<4>::find_entry(this_00,hash,hashPos,&entry->value_);
      if (pVVar8 == (ValueType *)0x0) {
        uVar7 = (uint)(hash >> ((char)hashPos * -6 + 0x3aU & 0x3f)) & 0x3f;
        uVar14 = (this_00->occupation).occupation | 1L << (ulong)uVar7;
        paVar21 = (array<HighsHashTableEntry<int,_void>,_54UL> *)POPCOUNT(uVar14);
        uVar4 = (uint)paVar21;
        puVar9 = (ulong *)operator_new((ulong)(uVar4 * 8 + 0x47 & 0xffffffc0));
        *puVar9 = 0;
        insertNode->ptrAndType = (ulong)puVar9 | 6;
        *puVar9 = uVar14;
        iVar13 = hashPos + 1;
        sVar11 = (sbyte)uVar7;
        if (iVar13 == 9) {
          local_70 = hash;
          memset(puVar9 + 1,0,
                 (ulong)((uVar4 + (paVar21 == (array<HighsHashTableEntry<int,_void>,_54UL> *)0x0)) *
                        8));
          if (0 < this_00->size) {
            lVar20 = 0;
            do {
              lVar16 = POPCOUNT(uVar14 >> ((byte)((uint)(this_00->hashes)._M_elems[lVar20] >> 10) &
                                          0x3f));
              if ((puVar9[lVar16] & 7) == 0) {
                puVar10 = (undefined8 *)operator_new(0x18);
                *puVar10 = 0;
                *(int *)(puVar10 + 1) = (this_00->entries)._M_elems[lVar20].value_;
                *(undefined4 *)(puVar10 + 2) = 1;
                puVar9[lVar16] = (ulong)puVar10 | 1;
              }
              else {
                puVar23 = (undefined8 *)(puVar9[lVar16] & 0xfffffffffffffff8);
                puVar10 = (undefined8 *)operator_new(0x10);
                uVar15 = puVar23[1];
                *puVar10 = *puVar23;
                puVar10[1] = uVar15;
                *puVar23 = puVar10;
                *(int *)(puVar23 + 1) = (this_00->entries)._M_elems[lVar20].value_;
                *(int *)(puVar23 + 2) = *(int *)(puVar23 + 2) + 1;
              }
              lVar20 = lVar20 + 1;
            } while (lVar20 < this_00->size);
          }
          operator_delete(this_00);
          if ((puVar9[POPCOUNT(uVar14 >> sVar11)] & 7) == 0) {
            puVar10 = (undefined8 *)operator_new(0x18);
            *puVar10 = 0;
            *(int *)(puVar10 + 1) = entry->value_;
            *(undefined4 *)(puVar10 + 2) = 1;
            puVar9[POPCOUNT(uVar14 >> sVar11)] = (ulong)puVar10 | 1;
            uVar15 = extraout_RDX_03;
          }
          else {
            puVar10 = (undefined8 *)(puVar9[POPCOUNT(uVar14 >> sVar11)] & 0xfffffffffffffff8);
            puVar23 = (undefined8 *)operator_new(0x10);
            uVar15 = puVar10[1];
            *puVar23 = *puVar10;
            puVar23[1] = uVar15;
            *puVar10 = puVar23;
            *(int *)(puVar10 + 1) = entry->value_;
            *(int *)(puVar10 + 2) = *(int *)(puVar10 + 2) + 1;
            uVar15 = extraout_RDX_01;
          }
          bVar3 = true;
          pVar24._9_7_ = (int7)((ulong)uVar15 >> 8);
          pVar24.second = true;
          pVar24.first = (int *)(puVar10 + 1);
          hash = local_70;
        }
        else if (uVar4 < 2) {
          insertNode = (NodePtr *)(puVar9 + 1);
          puVar9[1] = (ulong)this_00 | 5;
          InnerLeaf<4>::rehash(this_00,iVar13);
          pVar24._8_8_ = extraout_RDX_02;
          pVar24.first = (int *)paVar21;
          bVar3 = false;
          hashPos = iVar13;
        }
        else {
          uVar7 = this_00->size;
          iVar12 = (uVar7 - uVar4) + 2;
          bVar3 = iVar12 < 7;
          if (SBORROW4(iVar12,7) == (int)((uVar7 - uVar4) + -5) < 0) {
            local_68[0x20] = 0;
            local_68[0x21] = 0;
            local_68[0x22] = 0;
            local_68[0x23] = 0;
            local_68[0x24] = 0;
            local_68[0x25] = 0;
            local_68[0x26] = 0;
            local_68[0x27] = 0;
            local_68[0x28] = 0;
            local_68[0x29] = 0;
            local_68[0x2a] = 0;
            local_68[0x2b] = 0;
            local_68[0x2c] = 0;
            local_68[0x2d] = 0;
            local_68[0x2e] = 0;
            local_68[0x10] = 0;
            local_68[0x11] = 0;
            local_68[0x12] = 0;
            local_68[0x13] = 0;
            local_68[0x14] = 0;
            local_68[0x15] = 0;
            local_68[0x16] = 0;
            local_68[0x17] = 0;
            local_68[0x18] = 0;
            local_68[0x19] = 0;
            local_68[0x1a] = 0;
            local_68[0x1b] = 0;
            local_68[0x1c] = 0;
            local_68[0x1d] = 0;
            local_68[0x1e] = 0;
            local_68[0x1f] = 0;
            local_68[0] = 0;
            local_68[1] = 0;
            local_68[2] = 0;
            local_68[3] = 0;
            local_68[4] = 0;
            local_68[5] = 0;
            local_68[6] = 0;
            local_68[7] = 0;
            local_68[8] = 0;
            local_68[9] = 0;
            local_68[10] = 0;
            local_68[0xb] = 0;
            local_68[0xc] = 0;
            local_68[0xd] = 0;
            local_68[0xe] = 0;
            local_68[0xf] = 0;
            local_68[0x2f] = 0;
            local_68[0x30] = 0;
            local_68[0x31] = 0;
            local_68[0x32] = 0;
            local_68[0x33] = 0;
            local_68[0x34] = 0;
            local_68[0x35] = 0;
            local_68[0x36] = 0;
            pcVar2 = (char *)((long)&local_70 + POPCOUNT(uVar14 >> sVar11) + 7);
            *pcVar2 = *pcVar2 + '\x01';
            if (0 < (int)uVar7) {
              uVar17 = 0;
              do {
                pcVar2 = (char *)((long)&local_70 +
                                 POPCOUNT(uVar14 >> ((byte)((uint)(this_00->hashes)._M_elems[uVar17]
                                                           >> 10) & 0x3f)) + 7);
                *pcVar2 = *pcVar2 + '\x01';
                uVar17 = uVar17 + 1;
              } while (uVar7 != uVar17);
            }
            paVar19 = (array<HighsHashTableEntry<int,_void>,_54UL> *)(ulong)(uVar4 + (uVar4 == 0));
            pEVar22 = (Entry *)0x0;
            do {
              switch(local_68[(long)pEVar22] + 9 >> 4) {
              case 0:
                puVar10 = (undefined8 *)operator_new(0x60);
                uVar17 = 2;
                break;
              case 1:
                puVar10 = (undefined8 *)operator_new(0x120);
                uVar17 = 3;
                break;
              case 2:
                puVar10 = (undefined8 *)operator_new(0x1e0);
                uVar17 = 4;
                break;
              case 3:
                puVar10 = (undefined8 *)operator_new(0x2a0);
                uVar17 = 5;
                break;
              default:
                goto switchD_002785d9_default;
              }
              *puVar10 = 0;
              *(undefined4 *)(puVar10 + 1) = 0;
              puVar10[2] = 0;
              puVar9[(long)((long)&pEVar22->value_ + 1)] = uVar17 | (ulong)puVar10;
              paVar21 = paVar19;
switchD_002785d9_default:
              pEVar22 = (Entry *)((long)&pEVar22->value_ + 1);
            } while (paVar19 != (array<HighsHashTableEntry<int,_void>,_54UL> *)pEVar22);
            if (0 < this_00->size) {
              paVar21 = &this_00->entries;
              lVar20 = 0;
              do {
                uVar17 = puVar9[POPCOUNT(uVar14 >> ((byte)((uint)(this_00->hashes)._M_elems[lVar20]
                                                          >> 10) & 0x3f))];
                switch((uint)uVar17 & 7) {
                case 2:
                  uVar18 = (ulong)(uint)paVar21->_M_elems[0].value_;
                  InnerLeaf<1>::insert_entry
                            ((InnerLeaf<1> *)(uVar17 & 0xfffffffffffffff8),
                             uVar18 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20 ^
                             uVar18 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32,iVar13,
                             paVar21->_M_elems);
                  break;
                case 3:
                  uVar18 = (ulong)(uint)paVar21->_M_elems[0].value_;
                  InnerLeaf<2>::insert_entry
                            ((InnerLeaf<2> *)(uVar17 & 0xfffffffffffffff8),
                             uVar18 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20 ^
                             uVar18 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32,iVar13,
                             paVar21->_M_elems);
                  break;
                case 4:
                  uVar18 = (ulong)(uint)paVar21->_M_elems[0].value_;
                  InnerLeaf<3>::insert_entry
                            ((InnerLeaf<3> *)(uVar17 & 0xfffffffffffffff8),
                             uVar18 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20 ^
                             uVar18 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32,iVar13,
                             paVar21->_M_elems);
                  break;
                case 5:
                  uVar18 = (ulong)(uint)paVar21->_M_elems[0].value_;
                  InnerLeaf<4>::insert_entry
                            ((InnerLeaf<4> *)(uVar17 & 0xfffffffffffffff8),
                             uVar18 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20 ^
                             uVar18 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32,iVar13,
                             paVar21->_M_elems);
                }
                lVar20 = lVar20 + 1;
                paVar21 = (array<HighsHashTableEntry<int,_void>,_54UL> *)(paVar21->_M_elems + 1);
              } while (lVar20 < this_00->size);
            }
            operator_delete(this_00);
            pVar24._8_8_ = extraout_RDX_04;
            pVar24.first = (int *)paVar21;
            insertNode = (NodePtr *)(puVar9 + POPCOUNT(uVar14 >> sVar11));
            hashPos = iVar13;
          }
          else {
            pEVar22 = (Entry *)0x0;
            local_70 = hash;
            do {
              puVar10 = (undefined8 *)operator_new(0x60);
              *puVar10 = 0;
              *(undefined4 *)(puVar10 + 1) = 0;
              puVar10[2] = 0;
              puVar9[(long)((long)&pEVar22->value_ + 1)] = (ulong)puVar10 | 2;
              pEVar22 = (Entry *)((long)&pEVar22->value_ + 1);
            } while (paVar21 != (array<HighsHashTableEntry<int,_void>,_54UL> *)pEVar22);
            if (0 < this_00->size) {
              paVar21 = &this_00->entries;
              lVar20 = 0;
              do {
                uVar17 = (ulong)(uint)paVar21->_M_elems[0].value_;
                InnerLeaf<1>::insert_entry
                          ((InnerLeaf<1> *)
                           (puVar9[POPCOUNT(uVar14 >> ((byte)((uint)(this_00->hashes)._M_elems
                                                                    [lVar20] >> 10) & 0x3f))] &
                           0xfffffffffffffff8),
                           uVar17 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20 ^
                           uVar17 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32,iVar13,
                           paVar21->_M_elems);
                lVar20 = lVar20 + 1;
                paVar21 = (array<HighsHashTableEntry<int,_void>,_54UL> *)(paVar21->_M_elems + 1);
              } while (lVar20 < this_00->size);
            }
            operator_delete(this_00);
            hash = local_70;
            pVar24 = InnerLeaf<1>::insert_entry
                               ((InnerLeaf<1> *)
                                (puVar9[POPCOUNT(uVar14 >> sVar11)] & 0xfffffffffffffff8),local_70,
                                iVar13,entry);
          }
        }
      }
      else {
        bVar3 = true;
        pVar24._8_8_ = 0;
        pVar24.first = pVVar8;
      }
    }
    if (bVar3) {
      return pVar24;
    }
  case 7:
switchD_0027801c_caseD_7:
    pVar25 = insert_recurse(insertNode,hash,hashPos,entry);
    break;
  case 6:
    uVar17 = hash >> ((char)hashPos * -6 + 0x3aU & 0x3f);
    branch = (BranchNode *)(uVar14 & 0xfffffffffffffff8);
    uVar14 = (branch->occupation).occupation;
    bVar5 = (byte)uVar17;
    lVar20 = POPCOUNT(uVar14 >> (bVar5 & 0x3f));
    if ((uVar14 >> (uVar17 & 0x3f) & 1) == 0) {
      branch = addChildToBranchNode(branch,bVar5 & 0x3f,(int)lVar20);
      branch->child[lVar20].ptrAndType = 0;
      (branch->occupation).occupation = (branch->occupation).occupation | 1L << (bVar5 & 0x3f);
    }
    else {
      lVar20 = lVar20 + -1;
    }
    insertNode->ptrAndType = (ulong)branch | 6;
    hashPos = hashPos + 1;
    insertNode = branch->child + lVar20;
    goto switchD_0027801c_caseD_7;
  }
  return pVar25;
}

Assistant:

static std::pair<ValueType*, bool> insert_recurse(
      NodePtr* insertNode, uint64_t hash, int hashPos,
      HighsHashTableEntry<K, V>& entry) {
    switch (insertNode->getType()) {
      case kEmpty: {
        if (hashPos == kMaxDepth) {
          ListLeaf* leaf = new ListLeaf(std::move(entry));
          *insertNode = leaf;
          return std::make_pair(&leaf->first.entry.value(), true);
        } else {
          InnerLeaf<1>* leaf = new InnerLeaf<1>;
          *insertNode = leaf;
          return leaf->insert_entry(hash, hashPos, entry);
        }
      }
      case kListLeaf: {
        ListLeaf* leaf = insertNode->getListLeaf();
        ListNode* iter = &leaf->first;
        while (true) {
          // check for existing key
          if (iter->entry.key() == entry.key())
            return std::make_pair(&iter->entry.value(), false);

          if (iter->next == nullptr) {
            // reached the end of the list and key is not duplicate, so insert
            iter->next = new ListNode(std::move(entry));
            ++leaf->count;
            return std::make_pair(&iter->next->entry.value(), true);
          }
          iter = iter->next;
        }

        break;
      }
      case kInnerLeafSizeClass1:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass1(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass2:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass2(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass3:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass3(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass4: {
        InnerLeaf<4>* leaf = insertNode->getInnerLeafSizeClass4();
        if (leaf->size < InnerLeaf<4>::capacity())
          return leaf->insert_entry(hash, hashPos, entry);

        auto existingEntry = leaf->find_entry(hash, hashPos, entry.key());
        if (existingEntry) return std::make_pair(existingEntry, false);
        Occupation occupation = leaf->occupation;

        uint8_t hashChunk = get_hash_chunk(hash, hashPos);
        occupation.set(hashChunk);

        int branchSize = occupation.num_set();

        BranchNode* branch = createBranchingNode(branchSize);
        *insertNode = branch;
        branch->occupation = occupation;

        if (hashPos + 1 == kMaxDepth) {
          for (int i = 0; i < branchSize; ++i) branch->child[i] = nullptr;

          for (int i = 0; i < leaf->size; ++i) {
            int pos =
                occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                1;
            if (branch->child[pos].getType() == kEmpty)
              branch->child[pos] = new ListLeaf(std::move(leaf->entries[i]));
            else {
              ListLeaf* listLeaf = branch->child[pos].getListLeaf();
              ListNode* newNode = new ListNode(std::move(listLeaf->first));
              listLeaf->first.next = newNode;
              listLeaf->first.entry = std::move(leaf->entries[i]);
              ++listLeaf->count;
            }
          }

          delete leaf;

          ListLeaf* listLeaf;

          int pos = occupation.num_set_until(get_hash_chunk(hash, hashPos)) - 1;
          if (branch->child[pos].getType() == kEmpty) {
            listLeaf = new ListLeaf(std::move(entry));
            branch->child[pos] = listLeaf;
          } else {
            listLeaf = branch->child[pos].getListLeaf();
            ListNode* newNode = new ListNode(std::move(listLeaf->first));
            listLeaf->first.next = newNode;
            listLeaf->first.entry = std::move(entry);
            ++listLeaf->count;
          }

          return std::make_pair(&listLeaf->first.entry.value(), true);
        }

        if (branchSize > 1) {
          // maxsize in one bucket = number of items - (num buckets-1)
          // since each bucket has at least 1 item the largest one can only
          // have all remaining ones After adding the item: If it does not
          // collide
          int maxEntriesPerLeaf = 2 + leaf->size - branchSize;

          if (maxEntriesPerLeaf <= InnerLeaf<1>::capacity()) {
            // all items can go into the smallest leaf size
            for (int i = 0; i < branchSize; ++i)
              branch->child[i] = new InnerLeaf<1>;

            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;
              branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                  compute_hash(leaf->entries[i].key()), hashPos + 1,
                  leaf->entries[i]);
            }

            delete leaf;

            int pos =
                occupation.num_set_until(get_hash_chunk(hash, hashPos)) - 1;
            return branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                hash, hashPos + 1, entry);
          } else {
            // there are many collisions, determine the exact sizes first
            std::array<uint8_t, InnerLeaf<4>::capacity() + 1> sizes = {};
            sizes[occupation.num_set_until(hashChunk) - 1] += 1;
            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;
              sizes[pos] += 1;
            }

            for (int i = 0; i < branchSize; ++i) {
              switch (entries_to_size_class(sizes[i])) {
                case 1:
                  branch->child[i] = new InnerLeaf<1>;
                  break;
                case 2:
                  branch->child[i] = new InnerLeaf<2>;
                  break;
                case 3:
                  branch->child[i] = new InnerLeaf<3>;
                  break;
                case 4:
                  branch->child[i] = new InnerLeaf<4>;
                  break;
                default:
                  // Unexpected result from 'entries_to_size_class'
                  assert(false);
              }
            }

            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;

              switch (branch->child[pos].getType()) {
                case kInnerLeafSizeClass1:
                  branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass2:
                  branch->child[pos].getInnerLeafSizeClass2()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass3:
                  branch->child[pos].getInnerLeafSizeClass3()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass4:
                  branch->child[pos].getInnerLeafSizeClass4()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                default:
                  break;
              }
            }
          }

          delete leaf;

          int pos = occupation.num_set_until(hashChunk) - 1;
          insertNode = &branch->child[pos];
          ++hashPos;
        } else {
          // extremely unlikely that the new branch node only gets one
          // child in that case create it and defer the insertion into
          // the next depth
          branch->child[0] = leaf;
          insertNode = &branch->child[0];
          ++hashPos;
          leaf->rehash(hashPos);
        }

        break;
      }
      case kBranchNode: {
        BranchNode* branch = insertNode->getBranchNode();

        int location =
            branch->occupation.num_set_until(get_hash_chunk(hash, hashPos));

        if (branch->occupation.test(get_hash_chunk(hash, hashPos))) {
          --location;
        } else {
          branch = addChildToBranchNode(branch, get_hash_chunk(hash, hashPos),
                                        location);

          branch->child[location] = nullptr;
          branch->occupation.set(get_hash_chunk(hash, hashPos));
        }

        *insertNode = branch;
        insertNode = &branch->child[location];
        ++hashPos;
      }
    }

    return insert_recurse(insertNode, hash, hashPos, entry);
  }